

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O3

int ixmlElement_removeAttributeNode(IXML_Element *element,IXML_Attr *oldAttr,IXML_Attr **rtAttr)

{
  IXML_Attr *srcNode;
  Nodeptr p_Var1;
  Nodeptr p_Var2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0x69;
  if (oldAttr != (IXML_Attr *)0x0 && element != (IXML_Element *)0x0) {
    iVar4 = 8;
    for (srcNode = (IXML_Attr *)(element->n).firstAttr; srcNode != (IXML_Attr *)0x0;
        srcNode = (IXML_Attr *)(srcNode->n).nextSibling) {
      iVar3 = ixmlNode_compare(&srcNode->n,&oldAttr->n);
      if (iVar3 == 1) {
        p_Var1 = (srcNode->n).prevSibling;
        p_Var2 = (srcNode->n).nextSibling;
        if (p_Var1 != (Nodeptr)0x0) {
          p_Var1->nextSibling = p_Var2;
        }
        if (p_Var2 != (Nodeptr)0x0) {
          p_Var2->prevSibling = p_Var1;
        }
        if ((IXML_Attr *)(element->n).firstAttr == srcNode) {
          (element->n).firstAttr = p_Var2;
        }
        (srcNode->n).parentNode = (Nodeptr)0x0;
        (srcNode->n).prevSibling = (Nodeptr)0x0;
        (srcNode->n).nextSibling = (Nodeptr)0x0;
        *rtAttr = srcNode;
        return 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int ixmlElement_removeAttributeNode(
	IXML_Element *element, IXML_Attr *oldAttr, IXML_Attr **rtAttr)
{
	IXML_Node *attrNode;
	IXML_Node *preSib;
	IXML_Node *nextSib;

	if (element == NULL || oldAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	attrNode = ixmlElement_findAttributeNode(element, oldAttr);
	if (attrNode != NULL) {
		/* Has the attribute */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = nextSib;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = preSib;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = nextSib;
		}
		attrNode->parentNode = NULL;
		attrNode->prevSibling = NULL;
		attrNode->nextSibling = NULL;
		*rtAttr = (IXML_Attr *)attrNode;
		return IXML_SUCCESS;
	} else {
		return IXML_NOT_FOUND_ERR;
	}
}